

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O1

PSNodeFork * __thiscall
dg::pta::LLVMPointerGraphBuilder::createForkNode
          (LLVMPointerGraphBuilder *this,CallInst *CInst,PSNode *callNode)

{
  iterator __position;
  PSNodeFork *pPVar1;
  Value *val;
  PSNodesSeq *pPVar2;
  PSNodeFork *forkNode;
  PSNodeFork *local_28;
  
  local_28 = (PSNodeFork *)
             getOperand(this,*(Value **)
                              (CInst + (0x40 - (ulong)(uint)(*(int *)(CInst + 0x14) << 5))));
  pPVar1 = (PSNodeFork *)
           PointerGraph::create<(dg::pta::PSNodeType)13,dg::pta::PSNode*>
                     ((PointerGraph *)this,(PSNode **)&local_28);
  local_28 = (PSNodeFork *)0x0;
  if ((pPVar1->super_PSNode).type == FORK) {
    local_28 = pPVar1;
  }
  callNode->pairedNode = &local_28->super_PSNode;
  (local_28->super_PSNode).pairedNode = callNode;
  local_28->callInstruction = callNode;
  __position._M_current = *(PSNodeFork ***)(this + 0x200);
  if (__position._M_current == *(PSNodeFork ***)(this + 0x208)) {
    std::vector<dg::pta::PSNodeFork*,std::allocator<dg::pta::PSNodeFork*>>::
    _M_realloc_insert<dg::pta::PSNodeFork*const&>
              ((vector<dg::pta::PSNodeFork*,std::allocator<dg::pta::PSNodeFork*>> *)(this + 0x1f8),
               __position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    *(long *)(this + 0x200) = *(long *)(this + 0x200) + 8;
  }
  addArgumentOperands(this,CInst,callNode);
  val = (Value *)llvm::Value::stripPointerCasts();
  if ((val != (Value *)0x0) && (val[0x10] == (Value)0x0)) {
    pPVar2 = getNodes(this,val);
    addFunctionToFork(this,*(pPVar2->_nodes).
                            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,local_28);
  }
  return local_28;
}

Assistant:

PSNodeFork *LLVMPointerGraphBuilder::createForkNode(const llvm::CallInst *CInst,
                                                    PSNode *callNode) {
    using namespace llvm;
    PSNodeFork *forkNode = PSNodeFork::get(
            PS.create<PSNodeType::FORK>(getOperand(CInst->getArgOperand(2))));
    callNode->setPairedNode(forkNode);
    forkNode->setPairedNode(callNode);

    forkNode->setCallInst(callNode);

    forkNodes.push_back(forkNode);
    addArgumentOperands(*CInst, *callNode);

    const Value *spawnedFunc = CInst->getArgOperand(2)->stripPointerCasts();
    if (const Function *func = dyn_cast<Function>(spawnedFunc)) {
        addFunctionToFork(getNodes(func)->getSingleNode(), forkNode);
    }

    return forkNode;
}